

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

void __thiscall cxxopts::OptionException::~OptionException(OptionException *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__OptionException_0015fe00;
  pcVar1 = (this->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_message).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

OptionException(const std::string &message) : m_message(message) {}